

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VertexClustering::start(VertexClustering *this)

{
  bool bVar1;
  long in_RDI;
  VertexClustering *unaff_retaddr;
  bool in_stack_0000013f;
  VertexClustering *in_stack_00000140;
  
  printf("--- first clustering iteration ---\n");
  computeClusters(in_stack_00000140,in_stack_0000013f);
  if (((*(byte *)(in_RDI + 0xcb) & 1) != 0) && (bVar1 = removeUnconnected(unaff_retaddr), bVar1)) {
    printf("---second clustering iteration---\n");
    computeClusters(in_stack_00000140,in_stack_0000013f);
  }
  return;
}

Assistant:

void VertexClustering::start() {
	printf("--- first clustering iteration ---\n");
	computeClusters(false); 
	if (opts.validation) {
		if (removeUnconnected()) {
			printf("---second clustering iteration---\n");
			computeClusters(true);
		}
	}
}